

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  NodeRef root;
  Scene *pSVar1;
  float *pfVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  size_t k;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  uint uVar27;
  int iVar28;
  undefined4 uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar36;
  long lVar37;
  NodeRef *pNVar38;
  bool bVar39;
  float fVar40;
  vint4 ai_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar56;
  float fVar57;
  float fVar58;
  undefined1 in_ZMM0 [64];
  float fVar60;
  vint4 bi;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  vint4 bi_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  vint4 bi_3;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar95;
  float fVar96;
  vint4 bi_2;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar97;
  undefined1 auVar94 [16];
  vint4 ai;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar104;
  float fVar111;
  float fVar112;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar113;
  undefined1 auVar108 [16];
  float fVar114;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar115;
  float fVar122;
  float fVar124;
  vint4 ai_1;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar116;
  float fVar123;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar128;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [16];
  float fVar133;
  undefined1 auVar130 [16];
  vint4 ai_3;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [64];
  float fVar138;
  float fVar140;
  uint uVar141;
  float fVar142;
  uint uVar143;
  float fVar144;
  uint uVar145;
  undefined1 in_ZMM11 [64];
  undefined1 auVar139 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar146;
  uint uVar150;
  undefined1 auVar147 [16];
  uint uVar149;
  undefined1 auVar148 [64];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar160;
  float fVar164;
  float fVar165;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar166;
  Precalculations pre;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined1 local_19b8 [8];
  float fStack_19b0;
  float fStack_19ac;
  undefined1 local_19a8 [16];
  RayK<4> *local_1990;
  undefined1 local_1988 [16];
  undefined1 local_1978 [16];
  undefined1 local_1968 [8];
  float fStack_1960;
  float fStack_195c;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_18f8 [8];
  float fStack_18f0;
  float fStack_18ec;
  undefined1 local_18e8 [8];
  float fStack_18e0;
  float fStack_18dc;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  undefined1 local_1848 [16];
  undefined1 local_1838 [16];
  uint local_1828;
  uint uStack_1824;
  uint uStack_1820;
  uint uStack_181c;
  uint uStack_1818;
  uint uStack_1814;
  uint uStack_1810;
  uint uStack_180c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar5 = mm_lookupmask_ps._240_16_;
  uVar26 = mm_lookupmask_ps._8_8_;
  uVar25 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar84 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar86 = vpcmpeqd_avx(auVar84,(undefined1  [16])valid_i->field_0);
    auVar121 = ZEXT816(0) << 0x40;
    auVar73 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar121,5);
    auVar103 = auVar86 & auVar73;
    if ((((auVar103 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar103 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar103 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar103[0xf] < '\0'
       ) {
      auVar73 = vandps_avx(auVar73,auVar86);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar134._8_4_ = 0x7fffffff;
      auVar134._0_8_ = 0x7fffffff7fffffff;
      auVar134._12_4_ = 0x7fffffff;
      auVar86 = vandps_avx(auVar134,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar117._8_4_ = 0x219392ef;
      auVar117._0_8_ = 0x219392ef219392ef;
      auVar117._12_4_ = 0x219392ef;
      auVar86 = vcmpps_avx(auVar86,auVar117,1);
      auVar103 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar117,auVar86
                              );
      auVar86 = vandps_avx(auVar134,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar86 = vcmpps_avx(auVar86,auVar117,1);
      auVar55 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar117,auVar86)
      ;
      auVar86 = vandps_avx(auVar134,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar86 = vcmpps_avx(auVar86,auVar117,1);
      auVar86 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar117,auVar86)
      ;
      auVar91 = vrcpps_avx(auVar103);
      fVar57 = auVar91._0_4_;
      auVar85._0_4_ = auVar103._0_4_ * fVar57;
      fVar58 = auVar91._4_4_;
      auVar85._4_4_ = auVar103._4_4_ * fVar58;
      fVar59 = auVar91._8_4_;
      auVar85._8_4_ = auVar103._8_4_ * fVar59;
      fVar114 = auVar91._12_4_;
      auVar85._12_4_ = auVar103._12_4_ * fVar114;
      auVar118._8_4_ = 0x3f800000;
      auVar118._0_8_ = &DAT_3f8000003f800000;
      auVar118._12_4_ = 0x3f800000;
      auVar103 = vsubps_avx(auVar118,auVar85);
      tray.rdir.field_0._0_4_ = fVar57 + fVar57 * auVar103._0_4_;
      tray.rdir.field_0._4_4_ = fVar58 + fVar58 * auVar103._4_4_;
      tray.rdir.field_0._8_4_ = fVar59 + fVar59 * auVar103._8_4_;
      tray.rdir.field_0._12_4_ = fVar114 + fVar114 * auVar103._12_4_;
      auVar103 = vrcpps_avx(auVar55);
      fVar57 = auVar103._0_4_;
      auVar91._0_4_ = auVar55._0_4_ * fVar57;
      fVar58 = auVar103._4_4_;
      auVar91._4_4_ = auVar55._4_4_ * fVar58;
      fVar59 = auVar103._8_4_;
      auVar91._8_4_ = auVar55._8_4_ * fVar59;
      fVar114 = auVar103._12_4_;
      auVar91._12_4_ = auVar55._12_4_ * fVar114;
      auVar103 = vsubps_avx(auVar118,auVar91);
      tray.rdir.field_0._16_4_ = fVar57 + fVar57 * auVar103._0_4_;
      tray.rdir.field_0._20_4_ = fVar58 + fVar58 * auVar103._4_4_;
      tray.rdir.field_0._24_4_ = fVar59 + fVar59 * auVar103._8_4_;
      tray.rdir.field_0._28_4_ = fVar114 + fVar114 * auVar103._12_4_;
      auVar103 = vrcpps_avx(auVar86);
      fVar57 = auVar103._0_4_;
      auVar55._0_4_ = auVar86._0_4_ * fVar57;
      fVar58 = auVar103._4_4_;
      auVar55._4_4_ = auVar86._4_4_ * fVar58;
      fVar59 = auVar103._8_4_;
      auVar55._8_4_ = auVar86._8_4_ * fVar59;
      fVar114 = auVar103._12_4_;
      auVar55._12_4_ = auVar86._12_4_ * fVar114;
      auVar86 = vsubps_avx(auVar118,auVar55);
      tray.rdir.field_0._32_4_ = fVar57 + fVar57 * auVar86._0_4_;
      tray.rdir.field_0._36_4_ = fVar58 + fVar58 * auVar86._4_4_;
      tray.rdir.field_0._40_4_ = fVar59 + fVar59 * auVar86._8_4_;
      tray.rdir.field_0._44_4_ = fVar114 + fVar114 * auVar86._12_4_;
      auVar86 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar121,1);
      auVar105._8_4_ = 0x10;
      auVar105._0_8_ = 0x1000000010;
      auVar105._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar86,auVar105);
      auVar86 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar121,5);
      auVar103._8_4_ = 0x20;
      auVar103._0_8_ = 0x2000000020;
      auVar103._12_4_ = 0x20;
      auVar106._8_4_ = 0x30;
      auVar106._0_8_ = 0x3000000030;
      auVar106._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar106,auVar103,auVar86);
      auVar86 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar121,5);
      auVar98._8_4_ = 0x40;
      auVar98._0_8_ = 0x4000000040;
      auVar98._12_4_ = 0x40;
      auVar107._8_4_ = 0x50;
      auVar107._0_8_ = 0x5000000050;
      auVar107._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar107,auVar98,auVar86)
      ;
      auVar86 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar121);
      auVar103 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar121);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar137 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar86,auVar73);
      auVar86._8_4_ = 0xff800000;
      auVar86._0_8_ = 0xff800000ff800000;
      auVar86._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar86,auVar103,auVar73);
      terminated.field_0.i[1] = auVar73._4_4_ ^ auVar84._4_4_;
      terminated.field_0.i[0] = auVar73._0_4_ ^ auVar84._0_4_;
      terminated.field_0.i[2] = auVar73._8_4_ ^ auVar84._8_4_;
      terminated.field_0.i[3] = auVar73._12_4_ ^ auVar84._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar35 = 3;
      }
      else {
        uVar35 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1990 = ray + 0x80;
      pNVar38 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar36 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar84 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      auVar139 = ZEXT1664(auVar84);
LAB_003239b1:
      paVar36 = paVar36 + -1;
      root.ptr = pNVar38[-1].ptr;
      pNVar38 = pNVar38 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0032483f;
      aVar146 = *paVar36;
      auVar84 = vcmpps_avx((undefined1  [16])aVar146,(undefined1  [16])tray.tfar.field_0,1);
      uVar27 = vmovmskps_avx(auVar84);
      if (uVar27 == 0) {
        iVar28 = 2;
      }
      else {
        uVar32 = (ulong)(uVar27 & 0xff);
        uVar27 = POPCOUNT(uVar27 & 0xff);
        iVar28 = 0;
        if (uVar27 <= uVar35) {
          do {
            k = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> k & 1) == 0; k = k + 1) {
              }
            }
            auVar139 = ZEXT1664(auVar139._0_16_);
            bVar39 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar39) {
              terminated.field_0.i[k] = -1;
            }
            uVar32 = uVar32 & uVar32 - 1;
          } while (uVar32 != 0);
          auVar84 = vpcmpeqd_avx(auVar139._0_16_,auVar139._0_16_);
          auVar139 = ZEXT1664(auVar84);
          auVar84 = auVar84 & ~(undefined1  [16])terminated.field_0;
          iVar28 = 3;
          auVar137 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar84[0xf] < '\0') {
            auVar84._8_4_ = 0xff800000;
            auVar84._0_8_ = 0xff800000ff800000;
            auVar84._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar84,
                               (undefined1  [16])terminated.field_0);
            iVar28 = 2;
          }
        }
        if (uVar35 < uVar27) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0032483f;
              auVar84 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar146,6);
              if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar84[0xf] < '\0') {
                uVar32 = (ulong)((uint)root.ptr & 0xf);
                aVar56 = terminated.field_0;
                if (uVar32 == 8) goto LAB_003247fc;
                lVar37 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                uVar30 = 0;
                auVar84 = auVar139._0_16_ ^ (undefined1  [16])terminated.field_0;
                goto LAB_00323bee;
              }
              iVar28 = 2;
              break;
            }
            auVar148 = ZEXT1664(auVar137._0_16_);
            uVar32 = 0;
            uVar30 = 8;
            do {
              uVar31 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar32 * 8);
              if (uVar31 != 8) {
                uVar29 = *(undefined4 *)(root.ptr + 0x20 + uVar32 * 4);
                auVar41._4_4_ = uVar29;
                auVar41._0_4_ = uVar29;
                auVar41._8_4_ = uVar29;
                auVar41._12_4_ = uVar29;
                auVar19._8_8_ = tray.org.field_0._8_8_;
                auVar19._0_8_ = tray.org.field_0._0_8_;
                auVar20._8_8_ = tray.org.field_0._24_8_;
                auVar20._0_8_ = tray.org.field_0._16_8_;
                auVar21._8_8_ = tray.org.field_0._40_8_;
                auVar21._0_8_ = tray.org.field_0._32_8_;
                auVar84 = vsubps_avx(auVar41,auVar19);
                auVar99._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar84._0_4_;
                auVar99._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar84._4_4_;
                auVar99._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar84._8_4_;
                auVar99._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar84._12_4_;
                uVar29 = *(undefined4 *)(root.ptr + 0x40 + uVar32 * 4);
                auVar42._4_4_ = uVar29;
                auVar42._0_4_ = uVar29;
                auVar42._8_4_ = uVar29;
                auVar42._12_4_ = uVar29;
                auVar84 = vsubps_avx(auVar42,auVar20);
                auVar119._0_4_ = tray.rdir.field_0._16_4_ * auVar84._0_4_;
                auVar119._4_4_ = tray.rdir.field_0._20_4_ * auVar84._4_4_;
                auVar119._8_4_ = tray.rdir.field_0._24_4_ * auVar84._8_4_;
                auVar119._12_4_ = tray.rdir.field_0._28_4_ * auVar84._12_4_;
                uVar29 = *(undefined4 *)(root.ptr + 0x60 + uVar32 * 4);
                auVar43._4_4_ = uVar29;
                auVar43._0_4_ = uVar29;
                auVar43._8_4_ = uVar29;
                auVar43._12_4_ = uVar29;
                auVar84 = vsubps_avx(auVar43,auVar21);
                auVar135._0_4_ = tray.rdir.field_0._32_4_ * auVar84._0_4_;
                auVar135._4_4_ = tray.rdir.field_0._36_4_ * auVar84._4_4_;
                auVar135._8_4_ = tray.rdir.field_0._40_4_ * auVar84._8_4_;
                auVar135._12_4_ = tray.rdir.field_0._44_4_ * auVar84._12_4_;
                uVar29 = *(undefined4 *)(root.ptr + 0x30 + uVar32 * 4);
                auVar44._4_4_ = uVar29;
                auVar44._0_4_ = uVar29;
                auVar44._8_4_ = uVar29;
                auVar44._12_4_ = uVar29;
                auVar84 = vsubps_avx(auVar44,auVar19);
                auVar61._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar84._0_4_;
                auVar61._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar84._4_4_;
                auVar61._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar84._8_4_;
                auVar61._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar84._12_4_;
                uVar29 = *(undefined4 *)(root.ptr + 0x50 + uVar32 * 4);
                auVar45._4_4_ = uVar29;
                auVar45._0_4_ = uVar29;
                auVar45._8_4_ = uVar29;
                auVar45._12_4_ = uVar29;
                auVar84 = vsubps_avx(auVar45,auVar20);
                auVar75._0_4_ = tray.rdir.field_0._16_4_ * auVar84._0_4_;
                auVar75._4_4_ = tray.rdir.field_0._20_4_ * auVar84._4_4_;
                auVar75._8_4_ = tray.rdir.field_0._24_4_ * auVar84._8_4_;
                auVar75._12_4_ = tray.rdir.field_0._28_4_ * auVar84._12_4_;
                uVar29 = *(undefined4 *)(root.ptr + 0x70 + uVar32 * 4);
                auVar46._4_4_ = uVar29;
                auVar46._0_4_ = uVar29;
                auVar46._8_4_ = uVar29;
                auVar46._12_4_ = uVar29;
                auVar84 = vsubps_avx(auVar46,auVar21);
                auVar87._0_4_ = tray.rdir.field_0._32_4_ * auVar84._0_4_;
                auVar87._4_4_ = tray.rdir.field_0._36_4_ * auVar84._4_4_;
                auVar87._8_4_ = tray.rdir.field_0._40_4_ * auVar84._8_4_;
                auVar87._12_4_ = tray.rdir.field_0._44_4_ * auVar84._12_4_;
                auVar84 = vpminsd_avx(auVar99,auVar61);
                auVar86 = vpminsd_avx(auVar119,auVar75);
                auVar84 = vpmaxsd_avx(auVar84,auVar86);
                auVar86 = vpminsd_avx(auVar135,auVar87);
                auVar86 = vpmaxsd_avx(auVar84,auVar86);
                auVar84 = vpmaxsd_avx(auVar99,auVar61);
                auVar103 = vpmaxsd_avx(auVar119,auVar75);
                auVar103 = vpminsd_avx(auVar84,auVar103);
                auVar84 = vpmaxsd_avx(auVar135,auVar87);
                auVar103 = vpminsd_avx(auVar103,auVar84);
                auVar84 = vpmaxsd_avx(auVar86,(undefined1  [16])tray.tnear.field_0);
                auVar103 = vpminsd_avx(auVar103,(undefined1  [16])tray.tfar.field_0);
                auVar84 = vcmpps_avx(auVar84,auVar103,2);
                if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar84[0xf] < '\0') {
                  auVar84 = vblendvps_avx(auVar137._0_16_,auVar86,auVar84);
                  if (uVar30 != 8) {
                    pNVar38->ptr = uVar30;
                    pNVar38 = pNVar38 + 1;
                    *paVar36 = auVar148._0_16_;
                    paVar36 = paVar36 + 1;
                  }
                  auVar148 = ZEXT1664(auVar84);
                  uVar30 = uVar31;
                }
              }
              aVar146 = auVar148._0_16_;
            } while ((uVar31 != 8) && (bVar39 = uVar32 < 3, uVar32 = uVar32 + 1, bVar39));
            iVar28 = 0;
            if (uVar30 == 8) {
LAB_00323b96:
              bVar39 = false;
              iVar28 = 4;
            }
            else {
              auVar84 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar146,6);
              uVar29 = vmovmskps_avx(auVar84);
              bVar39 = true;
              if ((uint)POPCOUNT(uVar29) <= uVar35) {
                pNVar38->ptr = uVar30;
                pNVar38 = pNVar38 + 1;
                *paVar36 = aVar146;
                paVar36 = paVar36 + 1;
                goto LAB_00323b96;
              }
            }
            root.ptr = uVar30;
          } while (bVar39);
        }
      }
      goto LAB_00324842;
    }
  }
  return;
  while( true ) {
    uVar30 = uVar30 + 1;
    lVar37 = lVar37 + 0x60;
    auVar84 = auVar103;
    if (uVar32 - 8 <= uVar30) break;
LAB_00323bee:
    pSVar1 = context->scene;
    uVar31 = 0;
    auVar86 = auVar84;
    while (uVar27 = *(uint *)(lVar37 + uVar31 * 4), uVar27 != 0xffffffff) {
      uVar141 = *(uint *)(lVar37 + -0x10 + uVar31 * 4);
      pfVar2 = (pSVar1->vertices).items[uVar141];
      uVar34 = (ulong)*(uint *)(lVar37 + -0x50 + uVar31 * 4);
      uVar33 = (ulong)*(uint *)(lVar37 + -0x40 + uVar31 * 4);
      fVar57 = pfVar2[uVar34];
      auVar121._4_4_ = fVar57;
      auVar121._0_4_ = fVar57;
      auVar121._8_4_ = fVar57;
      auVar121._12_4_ = fVar57;
      fVar58 = pfVar2[uVar34 + 1];
      auVar62._4_4_ = fVar58;
      auVar62._0_4_ = fVar58;
      auVar62._8_4_ = fVar58;
      auVar62._12_4_ = fVar58;
      fVar59 = pfVar2[uVar34 + 2];
      auVar76._4_4_ = fVar59;
      auVar76._0_4_ = fVar59;
      auVar76._8_4_ = fVar59;
      auVar76._12_4_ = fVar59;
      local_18e8._4_4_ = pfVar2[uVar33];
      local_19b8._4_4_ = pfVar2[uVar33 + 1];
      local_1968._4_4_ = pfVar2[uVar33 + 2];
      uVar33 = (ulong)*(uint *)(lVar37 + -0x20 + uVar31 * 4);
      local_18f8._4_4_ = pfVar2[uVar33];
      fVar114 = pfVar2[uVar33 + 1];
      fVar40 = pfVar2[uVar33 + 2];
      local_18e8._0_4_ = local_18e8._4_4_;
      fStack_18e0 = (float)local_18e8._4_4_;
      fStack_18dc = (float)local_18e8._4_4_;
      fVar153 = fVar57 - (float)local_18e8._4_4_;
      local_19b8._0_4_ = local_19b8._4_4_;
      fStack_19b0 = (float)local_19b8._4_4_;
      fStack_19ac = (float)local_19b8._4_4_;
      fVar60 = fVar58 - (float)local_19b8._4_4_;
      local_1968._0_4_ = local_1968._4_4_;
      fStack_1960 = (float)local_1968._4_4_;
      fStack_195c = (float)local_1968._4_4_;
      fVar14 = fVar59 - (float)local_1968._4_4_;
      fVar58 = fVar114 - fVar58;
      fVar59 = fVar40 - fVar59;
      local_18f8._0_4_ = local_18f8._4_4_;
      fStack_18f0 = (float)local_18f8._4_4_;
      fStack_18ec = (float)local_18f8._4_4_;
      fVar57 = (float)local_18f8._4_4_ - fVar57;
      auVar103 = vsubps_avx(auVar121,*(undefined1 (*) [16])ray);
      auVar121 = vsubps_avx(auVar62,*(undefined1 (*) [16])(ray + 0x10));
      auVar55 = vsubps_avx(auVar76,*(undefined1 (*) [16])(ray + 0x20));
      fVar6 = *(float *)(ray + 0x50);
      fVar7 = *(float *)(ray + 0x54);
      fVar8 = *(float *)(ray + 0x58);
      fVar9 = *(float *)(ray + 0x5c);
      fVar10 = *(float *)(ray + 0x60);
      fVar11 = *(float *)(ray + 100);
      fVar12 = *(float *)(ray + 0x68);
      fVar13 = *(float *)(ray + 0x6c);
      fVar90 = auVar55._0_4_;
      auVar154._0_4_ = fVar90 * fVar6;
      fVar95 = auVar55._4_4_;
      auVar154._4_4_ = fVar95 * fVar7;
      fVar96 = auVar55._8_4_;
      auVar154._8_4_ = fVar96 * fVar8;
      fVar97 = auVar55._12_4_;
      auVar154._12_4_ = fVar97 * fVar9;
      fVar115 = auVar121._0_4_;
      auVar161._0_4_ = fVar115 * fVar10;
      fVar122 = auVar121._4_4_;
      auVar161._4_4_ = fVar122 * fVar11;
      fVar124 = auVar121._8_4_;
      auVar161._8_4_ = fVar124 * fVar12;
      fVar126 = auVar121._12_4_;
      auVar161._12_4_ = fVar126 * fVar13;
      auVar105 = vsubps_avx(auVar161,auVar154);
      fVar15 = *(float *)(ray + 0x40);
      fVar16 = *(float *)(ray + 0x44);
      fVar17 = *(float *)(ray + 0x48);
      fVar18 = *(float *)(ray + 0x4c);
      fVar104 = auVar103._0_4_;
      auVar155._0_4_ = fVar104 * fVar10;
      fVar111 = auVar103._4_4_;
      auVar155._4_4_ = fVar111 * fVar11;
      fVar112 = auVar103._8_4_;
      auVar155._8_4_ = fVar112 * fVar12;
      fVar113 = auVar103._12_4_;
      auVar155._12_4_ = fVar113 * fVar13;
      auVar162._0_4_ = fVar90 * fVar15;
      auVar162._4_4_ = fVar95 * fVar16;
      auVar162._8_4_ = fVar96 * fVar17;
      auVar162._12_4_ = fVar97 * fVar18;
      auVar106 = vsubps_avx(auVar162,auVar155);
      auVar163._0_4_ = fVar115 * fVar15;
      auVar163._4_4_ = fVar122 * fVar16;
      auVar163._8_4_ = fVar124 * fVar17;
      auVar163._12_4_ = fVar126 * fVar18;
      auVar156._0_4_ = fVar104 * fVar6;
      auVar156._4_4_ = fVar111 * fVar7;
      auVar156._8_4_ = fVar112 * fVar8;
      auVar156._12_4_ = fVar113 * fVar9;
      auVar107 = vsubps_avx(auVar156,auVar163);
      auVar103 = ZEXT416((uint)(fVar59 * fVar153 - fVar14 * fVar57));
      auVar121 = vshufps_avx(auVar103,auVar103,0);
      auVar103 = ZEXT416((uint)(fVar57 * fVar60 - fVar153 * fVar58));
      auVar55 = vshufps_avx(auVar103,auVar103,0);
      auVar117 = vpermilps_avx(ZEXT416((uint)(fVar14 * fVar58 - fVar59 * fVar60)),0);
      auVar92._0_4_ = auVar117._0_4_ * fVar15 + auVar121._0_4_ * fVar6 + auVar55._0_4_ * fVar10;
      auVar92._4_4_ = auVar117._4_4_ * fVar16 + auVar121._4_4_ * fVar7 + auVar55._4_4_ * fVar11;
      auVar92._8_4_ = auVar117._8_4_ * fVar17 + auVar121._8_4_ * fVar8 + auVar55._8_4_ * fVar12;
      auVar92._12_4_ = auVar117._12_4_ * fVar18 + auVar121._12_4_ * fVar9 + auVar55._12_4_ * fVar13;
      auVar91 = vshufps_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),0);
      auVar85 = vshufps_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59),0);
      auVar98 = vshufps_avx(ZEXT416((uint)fVar57),ZEXT416((uint)fVar57),0);
      uVar33 = (ulong)*(uint *)(lVar37 + -0x30 + uVar31 * 4);
      auVar63._8_4_ = 0x80000000;
      auVar63._0_8_ = 0x8000000080000000;
      auVar63._12_4_ = 0x80000000;
      auVar103 = vandps_avx(auVar92,auVar63);
      uVar143 = auVar103._0_4_;
      auVar129._0_4_ =
           (float)(uVar143 ^
                  (uint)(auVar105._0_4_ * auVar98._0_4_ +
                        auVar106._0_4_ * auVar91._0_4_ + auVar107._0_4_ * auVar85._0_4_));
      uVar145 = auVar103._4_4_;
      auVar129._4_4_ =
           (float)(uVar145 ^
                  (uint)(auVar105._4_4_ * auVar98._4_4_ +
                        auVar106._4_4_ * auVar91._4_4_ + auVar107._4_4_ * auVar85._4_4_));
      uVar149 = auVar103._8_4_;
      auVar129._8_4_ =
           (float)(uVar149 ^
                  (uint)(auVar105._8_4_ * auVar98._8_4_ +
                        auVar106._8_4_ * auVar91._8_4_ + auVar107._8_4_ * auVar85._8_4_));
      uVar150 = auVar103._12_4_;
      auVar129._12_4_ =
           (float)(uVar150 ^
                  (uint)(auVar105._12_4_ * auVar98._12_4_ +
                        auVar106._12_4_ * auVar91._12_4_ + auVar107._12_4_ * auVar85._12_4_));
      auVar103 = vcmpps_avx(auVar129,_DAT_01feba10,5);
      auVar91 = auVar86 & auVar103;
      fVar57 = pfVar2[uVar33];
      auVar157._4_4_ = fVar57;
      auVar157._0_4_ = fVar57;
      auVar157._8_4_ = fVar57;
      auVar157._12_4_ = fVar57;
      fVar57 = pfVar2[uVar33 + 1];
      auVar64._4_4_ = fVar57;
      auVar64._0_4_ = fVar57;
      auVar64._8_4_ = fVar57;
      auVar64._12_4_ = fVar57;
      fVar57 = pfVar2[uVar33 + 2];
      auVar93._4_4_ = fVar57;
      auVar93._0_4_ = fVar57;
      auVar93._8_4_ = fVar57;
      auVar93._12_4_ = fVar57;
      if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar91[0xf] < '\0'
         ) {
        auVar91 = vpermilps_avx(ZEXT416((uint)fVar153),0);
        auVar85 = vpermilps_avx(ZEXT416((uint)fVar60),0);
        auVar98 = vpermilps_avx(ZEXT416((uint)fVar14),0);
        auVar103 = vandps_avx(auVar103,auVar86);
        auVar108._0_4_ =
             (float)(uVar143 ^
                    (uint)(auVar91._0_4_ * auVar105._0_4_ +
                          auVar85._0_4_ * auVar106._0_4_ + auVar107._0_4_ * auVar98._0_4_));
        auVar108._4_4_ =
             (float)(uVar145 ^
                    (uint)(auVar91._4_4_ * auVar105._4_4_ +
                          auVar85._4_4_ * auVar106._4_4_ + auVar107._4_4_ * auVar98._4_4_));
        auVar108._8_4_ =
             (float)(uVar149 ^
                    (uint)(auVar91._8_4_ * auVar105._8_4_ +
                          auVar85._8_4_ * auVar106._8_4_ + auVar107._8_4_ * auVar98._8_4_));
        auVar108._12_4_ =
             (float)(uVar150 ^
                    (uint)(auVar91._12_4_ * auVar105._12_4_ +
                          auVar85._12_4_ * auVar106._12_4_ + auVar107._12_4_ * auVar98._12_4_));
        auVar91 = vcmpps_avx(auVar108,_DAT_01feba10,5);
        auVar85 = auVar103 & auVar91;
        local_1988 = auVar64;
        local_1978 = auVar157;
        if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar85[0xf] < '\0') {
          auVar48._8_4_ = 0x7fffffff;
          auVar48._0_8_ = 0x7fffffff7fffffff;
          auVar48._12_4_ = 0x7fffffff;
          auVar85 = vandps_avx(auVar92,auVar48);
          auVar103 = vandps_avx(auVar103,auVar91);
          auVar91 = vsubps_avx(auVar85,auVar129);
          auVar91 = vcmpps_avx(auVar91,auVar108,5);
          auVar98 = auVar103 & auVar91;
          if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar98[0xf] < '\0') {
            auVar103 = vandps_avx(auVar103,auVar91);
            auVar50._0_4_ =
                 (float)(uVar143 ^
                        (uint)(fVar104 * auVar117._0_4_ +
                              fVar115 * auVar121._0_4_ + auVar55._0_4_ * fVar90));
            auVar50._4_4_ =
                 (float)(uVar145 ^
                        (uint)(fVar111 * auVar117._4_4_ +
                              fVar122 * auVar121._4_4_ + auVar55._4_4_ * fVar95));
            auVar50._8_4_ =
                 (float)(uVar149 ^
                        (uint)(fVar112 * auVar117._8_4_ +
                              fVar124 * auVar121._8_4_ + auVar55._8_4_ * fVar96));
            auVar50._12_4_ =
                 (float)(uVar150 ^
                        (uint)(fVar113 * auVar117._12_4_ +
                              fVar126 * auVar121._12_4_ + auVar55._12_4_ * fVar97));
            fVar57 = auVar85._0_4_;
            auVar68._0_4_ = fVar57 * *(float *)(ray + 0x30);
            fVar58 = auVar85._4_4_;
            auVar68._4_4_ = fVar58 * *(float *)(ray + 0x34);
            fVar59 = auVar85._8_4_;
            auVar68._8_4_ = fVar59 * *(float *)(ray + 0x38);
            fVar153 = auVar85._12_4_;
            auVar68._12_4_ = fVar153 * *(float *)(ray + 0x3c);
            auVar91 = vcmpps_avx(auVar68,auVar50,1);
            auVar105 = *(undefined1 (*) [16])(ray + 0x80);
            auVar101._0_4_ = fVar57 * *(float *)(ray + 0x80);
            auVar101._4_4_ = fVar58 * *(float *)(ray + 0x84);
            auVar101._8_4_ = fVar59 * *(float *)(ray + 0x88);
            auVar101._12_4_ = fVar153 * *(float *)(ray + 0x8c);
            auVar98 = vcmpps_avx(auVar50,auVar101,2);
            auVar91 = vandps_avx(auVar98,auVar91);
            auVar98 = auVar103 & auVar91;
            if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar98[0xf] < '\0') {
              auVar103 = vandps_avx(auVar103,auVar91);
              auVar91 = vcmpps_avx(auVar92,_DAT_01feba10,4);
              auVar98 = auVar103 & auVar91;
              if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar98[0xf] < '\0') {
                auVar103 = vandps_avx(auVar91,auVar103);
                pGVar3 = (context->scene->geometries).items[uVar141].ptr;
                uVar143 = pGVar3->mask;
                auVar69._4_4_ = uVar143;
                auVar69._0_4_ = uVar143;
                auVar69._8_4_ = uVar143;
                auVar69._12_4_ = uVar143;
                auVar91 = vandps_avx(auVar69,*(undefined1 (*) [16])(ray + 0x90));
                auVar91 = vpcmpeqd_avx(auVar91,_DAT_01feba10);
                auVar98 = auVar103 & ~auVar91;
                if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar98[0xf] < '\0') {
                  auVar103 = vandnps_avx(auVar91,auVar103);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar91 = vrcpps_avx(auVar85);
                    fVar60 = auVar91._0_4_;
                    auVar120._0_4_ = fVar57 * fVar60;
                    fVar57 = auVar91._4_4_;
                    auVar120._4_4_ = fVar58 * fVar57;
                    fVar58 = auVar91._8_4_;
                    auVar120._8_4_ = fVar59 * fVar58;
                    fVar59 = auVar91._12_4_;
                    auVar120._12_4_ = fVar153 * fVar59;
                    auVar130._8_4_ = 0x3f800000;
                    auVar130._0_8_ = &DAT_3f8000003f800000;
                    auVar130._12_4_ = 0x3f800000;
                    auVar91 = vsubps_avx(auVar130,auVar120);
                    fVar60 = fVar60 + fVar60 * auVar91._0_4_;
                    fVar57 = fVar57 + fVar57 * auVar91._4_4_;
                    fVar58 = fVar58 + fVar58 * auVar91._8_4_;
                    fVar59 = fVar59 + fVar59 * auVar91._12_4_;
                    auVar89._0_4_ = fVar60 * auVar129._0_4_;
                    auVar89._4_4_ = fVar57 * auVar129._4_4_;
                    auVar89._8_4_ = fVar58 * auVar129._8_4_;
                    auVar89._12_4_ = fVar59 * auVar129._12_4_;
                    auVar91 = vminps_avx(auVar89,auVar130);
                    auVar109._0_4_ = fVar60 * auVar108._0_4_;
                    auVar109._4_4_ = fVar57 * auVar108._4_4_;
                    auVar109._8_4_ = fVar58 * auVar108._8_4_;
                    auVar109._12_4_ = fVar59 * auVar108._12_4_;
                    auVar85 = vminps_avx(auVar109,auVar130);
                    auVar98 = vsubps_avx(auVar130,auVar91);
                    auVar106 = vsubps_avx(auVar130,auVar85);
                    auVar22._8_8_ = uVar26;
                    auVar22._0_8_ = uVar25;
                    local_1868 = vblendvps_avx(auVar91,auVar98,auVar22);
                    local_1858 = vblendvps_avx(auVar85,auVar106,auVar22);
                    local_1838 = vpshufd_avx(ZEXT416(uVar141),0);
                    local_1848 = vpshufd_avx(ZEXT416(uVar27),0);
                    local_18c8 = auVar117._0_8_;
                    uStack_18c0 = auVar117._8_8_;
                    local_1898 = local_18c8;
                    uStack_1890 = uStack_18c0;
                    local_18b8 = auVar121._0_8_;
                    uStack_18b0 = auVar121._8_8_;
                    local_1888 = local_18b8;
                    uStack_1880 = uStack_18b0;
                    auVar53._0_4_ = fVar60 * auVar50._0_4_;
                    auVar53._4_4_ = fVar57 * auVar50._4_4_;
                    auVar53._8_4_ = fVar58 * auVar50._8_4_;
                    auVar53._12_4_ = fVar59 * auVar50._12_4_;
                    auVar74 = ZEXT1632(CONCAT412(fVar59,CONCAT48(fVar58,CONCAT44(fVar57,fVar60))));
                    vcmpps_avx(auVar74,auVar74,0xf);
                    uStack_1824 = context->user->instID[0];
                    local_1828 = uStack_1824;
                    uStack_1820 = uStack_1824;
                    uStack_181c = uStack_1824;
                    uStack_1818 = context->user->instPrimID[0];
                    uStack_1814 = uStack_1818;
                    uStack_1810 = uStack_1818;
                    uStack_180c = uStack_1818;
                    auVar121 = vblendvps_avx(auVar105,auVar53,auVar103);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar121;
                    args.valid = (int *)local_19a8;
                    args.geometryUserPtr = pGVar3->userPtr;
                    args.context = context->user;
                    args.hit = (RTCHitN *)&local_1898;
                    args.N = 4;
                    local_19a8 = auVar103;
                    args.ray = (RTCRayN *)ray;
                    local_1878 = auVar55;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&args);
                    }
                    if (local_19a8 == (undefined1  [16])0x0) {
                      auVar103 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar103 = auVar103 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&args);
                      }
                      auVar121 = vpcmpeqd_avx((undefined1  [16])0x0,local_19a8);
                      auVar103 = auVar121 ^ _DAT_01febe20;
                      auVar80._8_4_ = 0xff800000;
                      auVar80._0_8_ = 0xff800000ff800000;
                      auVar80._12_4_ = 0xff800000;
                      auVar121 = vblendvps_avx(auVar80,*(undefined1 (*) [16])(args.ray + 0x80),
                                               auVar121);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar121;
                    }
                    auVar121 = vpslld_avx(auVar103,0x1f);
                    auVar103 = vpsrad_avx(auVar121,0x1f);
                    auVar121 = vblendvps_avx(auVar105,*(undefined1 (*) [16])local_1990,auVar121);
                    *(undefined1 (*) [16])local_1990 = auVar121;
                  }
                  auVar86 = vpandn_avx(auVar103,auVar86);
                  auVar64 = local_1988;
                  auVar157 = local_1978;
                }
              }
            }
          }
        }
      }
      if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar86 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar86 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar86[0xf])
      {
        bVar39 = false;
        auVar103 = vpcmpeqd_avx(auVar55,auVar55);
      }
      else {
        auVar103 = vsubps_avx(auVar157,_local_18f8);
        auVar24._4_4_ = fVar114;
        auVar24._0_4_ = fVar114;
        auVar24._8_4_ = fVar114;
        auVar24._12_4_ = fVar114;
        auVar55 = vsubps_avx(auVar64,auVar24);
        auVar23._4_4_ = fVar40;
        auVar23._0_4_ = fVar40;
        auVar23._8_4_ = fVar40;
        auVar23._12_4_ = fVar40;
        auVar121 = vsubps_avx(auVar93,auVar23);
        auVar91 = vsubps_avx(_local_18e8,auVar157);
        auVar85 = vsubps_avx(_local_19b8,auVar64);
        auVar98 = vsubps_avx(_local_1968,auVar93);
        fVar57 = auVar55._0_4_;
        fVar160 = auVar98._0_4_;
        auVar47._0_4_ = fVar160 * fVar57;
        fVar40 = auVar55._4_4_;
        fVar164 = auVar98._4_4_;
        auVar47._4_4_ = fVar164 * fVar40;
        fVar6 = auVar55._8_4_;
        fVar165 = auVar98._8_4_;
        auVar47._8_4_ = fVar165 * fVar6;
        fVar10 = auVar55._12_4_;
        fVar166 = auVar98._12_4_;
        auVar47._12_4_ = fVar166 * fVar10;
        fVar58 = auVar121._0_4_;
        fVar138 = auVar85._0_4_;
        auVar65._0_4_ = fVar138 * fVar58;
        fVar153 = auVar121._4_4_;
        fVar140 = auVar85._4_4_;
        auVar65._4_4_ = fVar140 * fVar153;
        fVar7 = auVar121._8_4_;
        fVar142 = auVar85._8_4_;
        auVar65._8_4_ = fVar142 * fVar7;
        fVar11 = auVar121._12_4_;
        fVar144 = auVar85._12_4_;
        auVar65._12_4_ = fVar144 * fVar11;
        auVar85 = vsubps_avx(auVar65,auVar47);
        fVar59 = auVar91._0_4_;
        auVar66._0_4_ = fVar58 * fVar59;
        fVar60 = auVar91._4_4_;
        auVar66._4_4_ = fVar153 * fVar60;
        fVar8 = auVar91._8_4_;
        auVar66._8_4_ = fVar7 * fVar8;
        fVar12 = auVar91._12_4_;
        auVar66._12_4_ = fVar11 * fVar12;
        fVar114 = auVar103._0_4_;
        auVar77._0_4_ = fVar160 * fVar114;
        fVar14 = auVar103._4_4_;
        auVar77._4_4_ = fVar164 * fVar14;
        fVar9 = auVar103._8_4_;
        auVar77._8_4_ = fVar165 * fVar9;
        fVar13 = auVar103._12_4_;
        auVar77._12_4_ = fVar166 * fVar13;
        auVar91 = vsubps_avx(auVar77,auVar66);
        auVar78._0_4_ = fVar138 * fVar114;
        auVar78._4_4_ = fVar140 * fVar14;
        auVar78._8_4_ = fVar142 * fVar9;
        auVar78._12_4_ = fVar144 * fVar13;
        auVar100._0_4_ = fVar59 * fVar57;
        auVar100._4_4_ = fVar60 * fVar40;
        auVar100._8_4_ = fVar8 * fVar6;
        auVar100._12_4_ = fVar12 * fVar10;
        auVar98 = vsubps_avx(auVar100,auVar78);
        auVar103 = vsubps_avx(auVar157,*(undefined1 (*) [16])ray);
        auVar121 = vsubps_avx(auVar64,*(undefined1 (*) [16])(ray + 0x10));
        auVar105 = vsubps_avx(auVar93,*(undefined1 (*) [16])(ray + 0x20));
        fVar15 = *(float *)(ray + 0x50);
        fVar16 = *(float *)(ray + 0x54);
        fVar17 = *(float *)(ray + 0x58);
        fVar18 = *(float *)(ray + 0x5c);
        fVar104 = *(float *)(ray + 0x60);
        fVar111 = *(float *)(ray + 100);
        fVar112 = *(float *)(ray + 0x68);
        fVar113 = *(float *)(ray + 0x6c);
        fVar128 = auVar105._0_4_;
        auVar147._0_4_ = fVar128 * fVar15;
        fVar131 = auVar105._4_4_;
        auVar147._4_4_ = fVar131 * fVar16;
        fVar132 = auVar105._8_4_;
        auVar147._8_4_ = fVar132 * fVar17;
        fVar133 = auVar105._12_4_;
        auVar147._12_4_ = fVar133 * fVar18;
        fVar116 = auVar121._0_4_;
        auVar151._0_4_ = fVar116 * fVar104;
        fVar123 = auVar121._4_4_;
        auVar151._4_4_ = fVar123 * fVar111;
        fVar125 = auVar121._8_4_;
        auVar151._8_4_ = fVar125 * fVar112;
        fVar127 = auVar121._12_4_;
        auVar151._12_4_ = fVar127 * fVar113;
        auVar105 = vsubps_avx(auVar151,auVar147);
        fVar115 = *(float *)(ray + 0x40);
        fVar122 = *(float *)(ray + 0x44);
        fVar124 = *(float *)(ray + 0x48);
        fVar126 = *(float *)(ray + 0x4c);
        fVar90 = auVar103._0_4_;
        auVar152._0_4_ = fVar90 * fVar104;
        fVar95 = auVar103._4_4_;
        auVar152._4_4_ = fVar95 * fVar111;
        fVar96 = auVar103._8_4_;
        auVar152._8_4_ = fVar96 * fVar112;
        fVar97 = auVar103._12_4_;
        auVar152._12_4_ = fVar97 * fVar113;
        auVar158._0_4_ = fVar128 * fVar115;
        auVar158._4_4_ = fVar131 * fVar122;
        auVar158._8_4_ = fVar132 * fVar124;
        auVar158._12_4_ = fVar133 * fVar126;
        auVar106 = vsubps_avx(auVar158,auVar152);
        auVar159._0_4_ = fVar116 * fVar115;
        auVar159._4_4_ = fVar123 * fVar122;
        auVar159._8_4_ = fVar125 * fVar124;
        auVar159._12_4_ = fVar127 * fVar126;
        auVar79._0_4_ = fVar15 * fVar90;
        auVar79._4_4_ = fVar16 * fVar95;
        auVar79._8_4_ = fVar17 * fVar96;
        auVar79._12_4_ = fVar18 * fVar97;
        auVar107 = vsubps_avx(auVar79,auVar159);
        local_18e8._0_4_ = auVar85._0_4_;
        local_18e8._4_4_ = auVar85._4_4_;
        fStack_18e0 = auVar85._8_4_;
        fStack_18dc = auVar85._12_4_;
        auVar136._0_4_ =
             (float)local_18e8._0_4_ * fVar115 + fVar15 * auVar91._0_4_ + auVar98._0_4_ * fVar104;
        auVar136._4_4_ =
             (float)local_18e8._4_4_ * fVar122 + fVar16 * auVar91._4_4_ + auVar98._4_4_ * fVar111;
        auVar136._8_4_ = fStack_18e0 * fVar124 + fVar17 * auVar91._8_4_ + auVar98._8_4_ * fVar112;
        auVar136._12_4_ = fStack_18dc * fVar126 + fVar18 * auVar91._12_4_ + auVar98._12_4_ * fVar113
        ;
        auVar67._8_4_ = 0x80000000;
        auVar67._0_8_ = 0x8000000080000000;
        auVar67._12_4_ = 0x80000000;
        auVar103 = vandps_avx(auVar136,auVar67);
        uVar27 = auVar103._0_4_;
        auVar88._0_4_ =
             (float)(uVar27 ^ (uint)(auVar105._0_4_ * fVar59 +
                                    fVar138 * auVar106._0_4_ + fVar160 * auVar107._0_4_));
        uVar141 = auVar103._4_4_;
        auVar88._4_4_ =
             (float)(uVar141 ^
                    (uint)(auVar105._4_4_ * fVar60 +
                          fVar140 * auVar106._4_4_ + fVar164 * auVar107._4_4_));
        uVar143 = auVar103._8_4_;
        auVar88._8_4_ =
             (float)(uVar143 ^
                    (uint)(auVar105._8_4_ * fVar8 +
                          fVar142 * auVar106._8_4_ + fVar165 * auVar107._8_4_));
        uVar145 = auVar103._12_4_;
        auVar88._12_4_ =
             (float)(uVar145 ^
                    (uint)(auVar105._12_4_ * fVar12 +
                          fVar144 * auVar106._12_4_ + fVar166 * auVar107._12_4_));
        auVar121 = vcmpps_avx(auVar88,_DAT_01feba10,5);
        auVar117 = auVar86 & auVar121;
        _local_1968 = auVar55;
        if ((((auVar117 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar117 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar117 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < auVar117[0xf]) {
          auVar103 = vpcmpeqd_avx(auVar103,auVar103);
        }
        else {
          auVar121 = vandps_avx(auVar121,auVar86);
          auVar94._0_4_ =
               (float)(uVar27 ^ (uint)(auVar105._0_4_ * fVar114 +
                                      auVar106._0_4_ * fVar57 + fVar58 * auVar107._0_4_));
          auVar94._4_4_ =
               (float)(uVar141 ^
                      (uint)(auVar105._4_4_ * fVar14 +
                            auVar106._4_4_ * fVar40 + fVar153 * auVar107._4_4_));
          auVar94._8_4_ =
               (float)(uVar143 ^
                      (uint)(auVar105._8_4_ * fVar9 +
                            auVar106._8_4_ * fVar6 + fVar7 * auVar107._8_4_));
          auVar94._12_4_ =
               (float)(uVar145 ^
                      (uint)(auVar105._12_4_ * fVar13 +
                            auVar106._12_4_ * fVar10 + fVar11 * auVar107._12_4_));
          auVar55 = vcmpps_avx(auVar94,_DAT_01feba10,5);
          auVar105 = auVar121 & auVar55;
          if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar105 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar105 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar105[0xf]) {
            auVar103 = vpcmpeqd_avx(auVar103,auVar103);
          }
          else {
            auVar49._8_4_ = 0x7fffffff;
            auVar49._0_8_ = 0x7fffffff7fffffff;
            auVar49._12_4_ = 0x7fffffff;
            auVar105 = vandps_avx(auVar136,auVar49);
            auVar121 = vandps_avx(auVar55,auVar121);
            auVar55 = vsubps_avx(auVar105,auVar88);
            auVar55 = vcmpps_avx(auVar55,auVar94,5);
            auVar106 = auVar121 & auVar55;
            if ((((auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar106[0xf] < '\0') {
              auVar121 = vandps_avx(auVar55,auVar121);
              auVar102._0_4_ =
                   (float)(uVar27 ^ (uint)((float)local_18e8._0_4_ * fVar90 +
                                          fVar116 * auVar91._0_4_ + fVar128 * auVar98._0_4_));
              auVar102._4_4_ =
                   (float)(uVar141 ^
                          (uint)((float)local_18e8._4_4_ * fVar95 +
                                fVar123 * auVar91._4_4_ + fVar131 * auVar98._4_4_));
              auVar102._8_4_ =
                   (float)(uVar143 ^
                          (uint)(fStack_18e0 * fVar96 +
                                fVar125 * auVar91._8_4_ + fVar132 * auVar98._8_4_));
              auVar102._12_4_ =
                   (float)(uVar145 ^
                          (uint)(fStack_18dc * fVar97 +
                                fVar127 * auVar91._12_4_ + fVar133 * auVar98._12_4_));
              fVar57 = auVar105._0_4_;
              auVar51._0_4_ = fVar57 * *(float *)(ray + 0x30);
              fVar58 = auVar105._4_4_;
              auVar51._4_4_ = fVar58 * *(float *)(ray + 0x34);
              fVar59 = auVar105._8_4_;
              auVar51._8_4_ = fVar59 * *(float *)(ray + 0x38);
              fVar114 = auVar105._12_4_;
              auVar51._12_4_ = fVar114 * *(float *)(ray + 0x3c);
              auVar55 = vcmpps_avx(auVar51,auVar102,1);
              _local_1968 = *(undefined1 (*) [16])(ray + 0x80);
              auVar70._0_4_ = fVar57 * *(float *)(ray + 0x80);
              auVar70._4_4_ = fVar58 * *(float *)(ray + 0x84);
              auVar70._8_4_ = fVar59 * *(float *)(ray + 0x88);
              auVar70._12_4_ = fVar114 * *(float *)(ray + 0x8c);
              auVar106 = vcmpps_avx(auVar102,auVar70,2);
              auVar55 = vandps_avx(auVar106,auVar55);
              auVar106 = auVar121 & auVar55;
              if ((((auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar106[0xf] < '\0') {
                auVar121 = vandps_avx(auVar121,auVar55);
                auVar55 = vcmpps_avx(auVar136,_DAT_01feba10,4);
                auVar106 = auVar121 & auVar55;
                if ((((auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar106[0xf] < '\0') {
                  auVar121 = vandps_avx(auVar55,auVar121);
                  uVar141 = *(uint *)(lVar37 + -0x10 + uVar31 * 4);
                  pGVar3 = (context->scene->geometries).items[uVar141].ptr;
                  uVar27 = pGVar3->mask;
                  auVar52._4_4_ = uVar27;
                  auVar52._0_4_ = uVar27;
                  auVar52._8_4_ = uVar27;
                  auVar52._12_4_ = uVar27;
                  auVar55 = vandps_avx(auVar52,*(undefined1 (*) [16])(ray + 0x90));
                  auVar55 = vpcmpeqd_avx(auVar55,_DAT_01feba10);
                  auVar106 = auVar121 & ~auVar55;
                  if ((((auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar106[0xf] < '\0') {
                    auVar121 = vandnps_avx(auVar55,auVar121);
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar55 = vrcpps_avx(auVar105);
                      fVar40 = auVar55._0_4_;
                      auVar71._0_4_ = fVar57 * fVar40;
                      fVar57 = auVar55._4_4_;
                      auVar71._4_4_ = fVar58 * fVar57;
                      fVar58 = auVar55._8_4_;
                      auVar71._8_4_ = fVar59 * fVar58;
                      fVar59 = auVar55._12_4_;
                      auVar71._12_4_ = fVar114 * fVar59;
                      auVar110._8_4_ = 0x3f800000;
                      auVar110._0_8_ = &DAT_3f8000003f800000;
                      auVar110._12_4_ = 0x3f800000;
                      auVar55 = vsubps_avx(auVar110,auVar71);
                      fVar40 = fVar40 + fVar40 * auVar55._0_4_;
                      fVar57 = fVar57 + fVar57 * auVar55._4_4_;
                      fVar58 = fVar58 + fVar58 * auVar55._8_4_;
                      fVar59 = fVar59 + fVar59 * auVar55._12_4_;
                      auVar72._0_4_ = fVar40 * auVar88._0_4_;
                      auVar72._4_4_ = fVar57 * auVar88._4_4_;
                      auVar72._8_4_ = fVar58 * auVar88._8_4_;
                      auVar72._12_4_ = fVar59 * auVar88._12_4_;
                      auVar55 = vminps_avx(auVar72,auVar110);
                      auVar81._0_4_ = fVar40 * auVar94._0_4_;
                      auVar81._4_4_ = fVar57 * auVar94._4_4_;
                      auVar81._8_4_ = fVar58 * auVar94._8_4_;
                      auVar81._12_4_ = fVar59 * auVar94._12_4_;
                      auVar105 = vminps_avx(auVar81,auVar110);
                      auVar106 = vsubps_avx(auVar110,auVar55);
                      auVar107 = vsubps_avx(auVar110,auVar105);
                      local_1868 = vblendvps_avx(auVar55,auVar106,auVar5);
                      local_1858 = vblendvps_avx(auVar105,auVar107,auVar5);
                      local_1838 = vpshufd_avx(ZEXT416(uVar141),0);
                      local_1848 = vpshufd_avx(ZEXT416(*(uint *)(lVar37 + uVar31 * 4)),0);
                      local_1898 = auVar85._0_8_;
                      uStack_1890 = auVar85._8_8_;
                      local_19c8 = auVar91._0_8_;
                      uStack_19c0 = auVar91._8_8_;
                      local_1888 = local_19c8;
                      uStack_1880 = uStack_19c0;
                      auVar54._0_4_ = fVar40 * auVar102._0_4_;
                      auVar54._4_4_ = fVar57 * auVar102._4_4_;
                      auVar54._8_4_ = fVar58 * auVar102._8_4_;
                      auVar54._12_4_ = fVar59 * auVar102._12_4_;
                      vcmpps_avx(ZEXT1632(local_1868),ZEXT1632(local_1868),0xf);
                      uStack_1824 = context->user->instID[0];
                      local_1828 = uStack_1824;
                      uStack_1820 = uStack_1824;
                      uStack_181c = uStack_1824;
                      uStack_1818 = context->user->instPrimID[0];
                      uStack_1814 = uStack_1818;
                      uStack_1810 = uStack_1818;
                      uStack_180c = uStack_1818;
                      auVar55 = vblendvps_avx(_local_1968,auVar54,auVar121);
                      *(undefined1 (*) [16])(ray + 0x80) = auVar55;
                      args.valid = (int *)local_19a8;
                      args.geometryUserPtr = pGVar3->userPtr;
                      args.context = context->user;
                      args.hit = (RTCHitN *)&local_1898;
                      args.N = 4;
                      local_19a8 = auVar121;
                      args.ray = (RTCRayN *)ray;
                      local_1878 = auVar98;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar3->occlusionFilterN)(&args);
                      }
                      if (local_19a8 == (undefined1  [16])0x0) {
                        auVar121 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar121 = auVar121 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var4)(&args);
                        }
                        auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,local_19a8);
                        auVar121 = auVar55 ^ _DAT_01febe20;
                        auVar82._8_4_ = 0xff800000;
                        auVar82._0_8_ = 0xff800000ff800000;
                        auVar82._12_4_ = 0xff800000;
                        auVar55 = vblendvps_avx(auVar82,*(undefined1 (*) [16])(args.ray + 0x80),
                                                auVar55);
                        *(undefined1 (*) [16])(args.ray + 0x80) = auVar55;
                      }
                      auVar55 = vpslld_avx(auVar121,0x1f);
                      auVar121 = vpsrad_avx(auVar55,0x1f);
                      auVar55 = vblendvps_avx(_local_1968,*(undefined1 (*) [16])local_1990,auVar55);
                      *(undefined1 (*) [16])local_1990 = auVar55;
                    }
                    auVar86 = vpandn_avx(auVar121,auVar86);
                    auVar103 = vpcmpeqd_avx(auVar103,auVar103);
                    goto LAB_00323f6c;
                  }
                }
              }
            }
            auVar103 = vpcmpeqd_avx(auVar103,auVar103);
          }
        }
LAB_00323f6c:
        bVar39 = (((auVar86 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  (auVar86 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar86 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 auVar86[0xf] < '\0';
      }
      auVar139 = ZEXT1664(auVar103);
      auVar137 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      if ((!bVar39) || (bVar39 = 2 < uVar31, uVar31 = uVar31 + 1, bVar39)) break;
    }
    auVar103 = vpand_avx(auVar86,auVar84);
    auVar84 = auVar84 & auVar86;
    if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar84 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar84 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar84[0xf])
    break;
  }
  aVar56 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar139._0_16_ ^ auVar103);
LAB_003247fc:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])aVar56,(undefined1  [16])terminated.field_0);
  auVar84 = auVar139._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar84 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar84 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar84[0xf]) {
LAB_0032483f:
    iVar28 = 3;
  }
  else {
    auVar83._8_4_ = 0xff800000;
    auVar83._0_8_ = 0xff800000ff800000;
    auVar83._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar83,
                       (undefined1  [16])terminated.field_0);
    iVar28 = 0;
  }
LAB_00324842:
  if (iVar28 == 3) {
    auVar5 = vandps_avx(auVar73,(undefined1  [16])terminated.field_0);
    auVar73._8_4_ = 0xff800000;
    auVar73._0_8_ = 0xff800000ff800000;
    auVar73._12_4_ = 0xff800000;
    auVar5 = vmaskmovps_avx(auVar5,auVar73);
    *(undefined1 (*) [16])local_1990 = auVar5;
    return;
  }
  goto LAB_003239b1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }